

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::AesGcmCtrV1::write(AesGcmCtrV1 *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"AesGcmCtrV1");
  if (((byte)this->__isset & 1) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"aad_prefix",0xb,1);
    iVar3 = (*this_00->_vptr_TProtocol[0x16])(this_00,&this->aad_prefix);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar3 + iVar4 + iVar2 + iVar1;
  }
  if (((byte)this->__isset & 2) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"aad_file_unique",0xb,2);
    iVar3 = (*this_00->_vptr_TProtocol[0x16])(this_00,&this->aad_file_unique);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar3 + iVar4 + iVar2 + iVar1;
  }
  if (((byte)this->__isset & 4) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"supply_aad_prefix",2,3);
    iVar3 = (*this_00->_vptr_TProtocol[0xf])(this_00,(ulong)this->supply_aad_prefix);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar3 + iVar4 + iVar2 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t AesGcmCtrV1::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("AesGcmCtrV1");

  if (this->__isset.aad_prefix) {
    xfer += oprot->writeFieldBegin("aad_prefix", ::apache::thrift::protocol::T_STRING, 1);
    xfer += oprot->writeBinary(this->aad_prefix);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.aad_file_unique) {
    xfer += oprot->writeFieldBegin("aad_file_unique", ::apache::thrift::protocol::T_STRING, 2);
    xfer += oprot->writeBinary(this->aad_file_unique);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.supply_aad_prefix) {
    xfer += oprot->writeFieldBegin("supply_aad_prefix", ::apache::thrift::protocol::T_BOOL, 3);
    xfer += oprot->writeBool(this->supply_aad_prefix);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}